

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntRemapArray(Vec_Int_t *vOld2New,Vec_Int_t *vOld,Vec_Int_t *vNew,int nNew)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  
  if (vOld->nSize != 0) {
    if (vNew->nCap < nNew) {
      if (vNew->pArray == (int *)0x0) {
        piVar2 = (int *)malloc((long)nNew << 2);
      }
      else {
        piVar2 = (int *)realloc(vNew->pArray,(long)nNew << 2);
      }
      vNew->pArray = piVar2;
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vNew->nCap = nNew;
    }
    if (0 < nNew) {
      memset(vNew->pArray,0,(ulong)(uint)nNew << 2);
    }
    vNew->nSize = nNew;
    if (0 < vOld2New->nSize) {
      piVar2 = vOld2New->pArray;
      lVar3 = 0;
      do {
        uVar1 = piVar2[lVar3];
        if ((((int)uVar1 < nNew && 0 < (int)uVar1) && (lVar3 < vOld->nSize)) &&
           (vOld->pArray[lVar3] != 0)) {
          if (((int)uVar1 < 0) || (vNew->nSize <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          vNew->pArray[uVar1] = vOld->pArray[lVar3];
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < vOld2New->nSize);
    }
  }
  return;
}

Assistant:

static inline void Vec_IntRemapArray( Vec_Int_t * vOld2New, Vec_Int_t * vOld, Vec_Int_t * vNew, int nNew )
{
    int iOld, iNew;
    if ( Vec_IntSize(vOld) == 0 )
        return;
    Vec_IntFill( vNew, nNew, 0 );
    Vec_IntForEachEntry( vOld2New, iNew, iOld )
        if ( iNew > 0 && iNew < nNew && iOld < Vec_IntSize(vOld) && Vec_IntEntry(vOld, iOld) != 0 )
            Vec_IntWriteEntry( vNew, iNew, Vec_IntEntry(vOld, iOld) );
}